

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
::LookupBucketFor<llbuild::core::KeyID>
          (DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
           *this,KeyID *Val,DenseMapPair<llbuild::core::KeyID,_DBKeyID> **FoundBucket)

{
  ValueTy VVar1;
  long lVar2;
  ValueTy VVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *pDVar9;
  int iVar10;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *pDVar11;
  
  if (*(int *)(this + 0x10) == 0) {
    *FoundBucket = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)0x0;
    bVar5 = 0;
  }
  else {
    VVar1 = Val->_value;
    if (VVar1 + 1 < 2) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                    ,0x24d,
                    "bool llvm::DenseMapBase<llvm::DenseMap<llbuild::core::KeyID, DBKeyID>, llbuild::core::KeyID, DBKeyID, llvm::DenseMapInfo<llbuild::core::KeyID>, llvm::detail::DenseMapPair<llbuild::core::KeyID, DBKeyID>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<llbuild::core::KeyID, DBKeyID>, KeyT = llbuild::core::KeyID, ValueT = DBKeyID, KeyInfoT = llvm::DenseMapInfo<llbuild::core::KeyID>, BucketT = llvm::detail::DenseMapPair<llbuild::core::KeyID, DBKeyID>, LookupKeyT = llbuild::core::KeyID]"
                   );
    }
    lVar2 = *(long *)this;
    iVar6 = (int)VVar1 * 9;
    uVar7 = *(int *)(this + 0x10) - 1;
    uVar8 = (int)VVar1 * 0x25 & uVar7;
    iVar10 = 1;
    pDVar9 = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)0x0;
    do {
      pDVar11 = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)(lVar2 + (ulong)uVar8 * 0x10);
      VVar3 = *(ValueTy *)(lVar2 + (ulong)uVar8 * 0x10);
      if (VVar1 == VVar3) {
        *FoundBucket = pDVar11;
        iVar6 = 1;
        bVar4 = false;
      }
      else if (VVar3 == 0) {
        if (pDVar9 != (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)0x0) {
          pDVar11 = pDVar9;
        }
        *FoundBucket = pDVar11;
        bVar4 = false;
        iVar6 = 0;
      }
      else {
        if (VVar3 == 0xffffffffffffffff &&
            pDVar9 == (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)0x0) {
          pDVar9 = pDVar11;
        }
        uVar8 = uVar8 + iVar10;
        iVar10 = iVar10 + 1;
        uVar8 = uVar8 & uVar7;
        bVar4 = true;
      }
      bVar5 = (byte)iVar6;
    } while (bVar4);
  }
  return (bool)(bVar5 & 1);
}

Assistant:

unsigned getNumBuckets() const {
    return NumBuckets;
  }